

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O0

void __thiscall QMakeParser::leaveScope(QMakeParser *this,ushort **tokPtr)

{
  undefined2 *puVar1;
  ushort *puVar2;
  BlockScope *pBVar3;
  long *in_RSI;
  long in_RDI;
  uint len;
  ushort *start;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  
  pBVar3 = QStack<QMakeParser::BlockScope>::top((QStack<QMakeParser::BlockScope> *)0x314de5);
  if ((pBVar3->inBranch & 1U) != 0) {
    puVar1 = (undefined2 *)*in_RSI;
    *in_RSI = (long)(puVar1 + 1);
    *puVar1 = 0;
    puVar1 = (undefined2 *)*in_RSI;
    *in_RSI = (long)(puVar1 + 1);
    *puVar1 = 0;
  }
  pBVar3 = QStack<QMakeParser::BlockScope>::top((QStack<QMakeParser::BlockScope> *)0x314e50);
  puVar2 = pBVar3->start;
  if (puVar2 != (ushort *)0x0) {
    puVar1 = (undefined2 *)*in_RSI;
    *in_RSI = (long)(puVar1 + 1);
    *puVar1 = 0;
    in_stack_ffffffffffffffb4 = (int)(*in_RSI - (long)puVar2 >> 1) + -2;
    *(int *)puVar2 = in_stack_ffffffffffffffb4;
  }
  QList<QMakeParser::BlockScope>::size((QList<QMakeParser::BlockScope> *)(in_RDI + 0x10));
  QList<QMakeParser::BlockScope>::resize
            ((QList<QMakeParser::BlockScope> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RDI);
  return;
}

Assistant:

void QMakeParser::leaveScope(ushort *&tokPtr)
{
    if (m_blockstack.top().inBranch) {
        // Put empty else block
        putBlockLen(tokPtr, 0);
    }
    if (ushort *start = m_blockstack.top().start) {
        putTok(tokPtr, TokTerminator);
        uint len = tokPtr - start - 2;
        start[0] = (ushort)len;
        start[1] = (ushort)(len >> 16);
    }
    m_blockstack.resize(m_blockstack.size() - 1);
}